

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_decoder_config *
ma_decoder_config_init(ma_format outputFormat,ma_uint32 outputChannels,ma_uint32 outputSampleRate)

{
  ma_uint32 in_ECX;
  ma_uint32 in_EDX;
  ma_format in_ESI;
  ma_decoder_config *in_RDI;
  ma_decoder_config *pmVar1;
  ma_uint32 in_stack_ffffffffffffffb0;
  ma_format in_stack_ffffffffffffffb4;
  
  pmVar1 = in_RDI;
  if (in_RDI != (ma_decoder_config *)0x0) {
    memset(in_RDI,0,0x90);
  }
  in_RDI->format = in_ESI;
  in_RDI->channels = in_EDX;
  in_RDI->sampleRate = in_ECX;
  ma_resampler_config_init
            (in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,(ma_uint32)((ulong)pmVar1 >> 0x20),
             (ma_uint32)pmVar1,(ma_resample_algorithm)((ulong)in_RDI >> 0x20));
  memcpy(&in_RDI->resampling,&stack0xffffffffffffffb0,0x30);
  in_RDI->encodingFormat = ma_encoding_format_unknown;
  return pmVar1;
}

Assistant:

MA_API ma_decoder_config ma_decoder_config_init(ma_format outputFormat, ma_uint32 outputChannels, ma_uint32 outputSampleRate)
{
    ma_decoder_config config;
    MA_ZERO_OBJECT(&config);
    config.format         = outputFormat;
    config.channels       = outputChannels;
    config.sampleRate     = outputSampleRate;
    config.resampling     = ma_resampler_config_init(ma_format_unknown, 0, 0, 0, ma_resample_algorithm_linear); /* Format/channels/rate doesn't matter here. */
    config.encodingFormat = ma_encoding_format_unknown;

    /* Note that we are intentionally leaving the channel map empty here which will cause the default channel map to be used. */

    return config;
}